

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

void aes_ecb4x(uchar *out,uint32_t *ivw,uint64_t *sk_exp,uint nrounds)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint32_t w [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puVar13 = &local_c8;
  uVar2 = (ulong)nrounds;
  local_78 = *(undefined8 *)ivw;
  uStack_70 = *(undefined8 *)(ivw + 2);
  local_68 = *(undefined8 *)(ivw + 4);
  uStack_60 = *(undefined8 *)(ivw + 6);
  local_58 = *(undefined8 *)(ivw + 8);
  uStack_50 = *(undefined8 *)(ivw + 10);
  local_48 = *(undefined8 *)(ivw + 0xc);
  uStack_40 = *(undefined8 *)(ivw + 0xe);
  lVar17 = 0;
  do {
    br_aes_ct64_interleave_in(puVar13,puVar13 + 4,(uint32_t *)((long)&local_78 + lVar17));
    lVar17 = lVar17 + 0x10;
    puVar13 = puVar13 + 1;
  } while (lVar17 != 0x40);
  br_aes_ct64_ortho(&local_c8);
  local_c8 = CONCAT44(*(uint *)((long)sk_exp + 4) ^ local_c8._4_4_,(uint)*sk_exp ^ (uint)local_c8);
  uStack_c0 = CONCAT44(*(uint *)((long)sk_exp + 0xc) ^ uStack_c0._4_4_,
                       (uint)sk_exp[1] ^ (uint)uStack_c0);
  local_b8 = CONCAT44(*(uint *)((long)sk_exp + 0x14) ^ local_b8._4_4_,
                      (uint)sk_exp[2] ^ (uint)local_b8);
  uStack_b0 = CONCAT44(*(uint *)((long)sk_exp + 0x1c) ^ uStack_b0._4_4_,
                       (uint)sk_exp[3] ^ (uint)uStack_b0);
  local_a8 = CONCAT44(*(uint *)((long)sk_exp + 0x24) ^ local_a8._4_4_,
                      (uint)sk_exp[4] ^ (uint)local_a8);
  uStack_a0 = CONCAT44(*(uint *)((long)sk_exp + 0x2c) ^ uStack_a0._4_4_,
                       (uint)sk_exp[5] ^ (uint)uStack_a0);
  local_98 = sk_exp[6] ^ local_98;
  uStack_90 = sk_exp[7] ^ uStack_90;
  local_88 = uVar2;
  if (1 < nrounds) {
    uVar6 = 1;
    local_80 = uVar2;
    do {
      br_aes_ct64_bitslice_Sbox(&local_c8);
      lVar17 = 0;
      do {
        uVar2 = (&local_c8)[lVar17];
        uVar3 = (&uStack_c0)[lVar17];
        (&local_c8)[lVar17] =
             (uVar2 & 0xfff000000000000) << 4 |
             uVar2 >> 0xc & 0xf000000000000 | (uVar2 & 0xff00000000) << 8 |
             uVar2 >> 8 & 0xff00000000 | (uVar2 & 0xf0000) << 0xc |
             uVar2 >> 4 & 0xfff0000 | uVar2 & 0xffff;
        (&uStack_c0)[lVar17] =
             (uVar3 & 0xfff000000000000) << 4 |
             uVar3 >> 0xc & 0xf000000000000 | (uVar3 & 0xff00000000) << 8 |
             uVar3 >> 8 & 0xff00000000 | (uVar3 & 0xf0000) << 0xc |
             uVar3 >> 4 & 0xfff0000 | uVar3 & 0xffff;
        lVar17 = lVar17 + 2;
      } while (lVar17 != 8);
      uVar7 = local_c8 << 0x30 | local_c8 >> 0x10;
      uVar2 = uStack_c0 << 0x30 | uStack_c0 >> 0x10;
      uVar11 = local_b8 << 0x30 | local_b8 >> 0x10;
      uVar12 = uStack_b0 << 0x30 | uStack_b0 >> 0x10;
      uVar8 = uStack_90 << 0x30 | uStack_90 >> 0x10;
      uStack_90 = uStack_90 ^ uVar8;
      uVar14 = local_c8 ^ uVar7;
      uVar15 = local_a8 << 0x30 | local_a8 >> 0x10;
      uVar16 = uStack_c0 ^ uVar2;
      uVar9 = local_b8 ^ uVar11;
      uVar18 = uStack_b0 ^ uVar12;
      uVar5 = local_a8 ^ uVar15;
      uVar3 = uStack_a0 << 0x30 | uStack_a0 >> 0x10;
      uVar10 = uStack_a0 ^ uVar3;
      uVar4 = local_98 << 0x30 | local_98 >> 0x10;
      uVar19 = local_98 ^ uVar4;
      local_c8 = uVar7 ^ uStack_90 ^ (uVar14 << 0x20 | uVar14 >> 0x20) ^ sk_exp[uVar6 * 8];
      uStack_c0 = uStack_90 ^ uVar14 ^ uVar2 ^ (uVar16 << 0x20 | uVar16 >> 0x20) ^
                  sk_exp[uVar6 * 8 + 1];
      local_b8 = uVar16 ^ uVar11 ^ (uVar9 << 0x20 | uVar9 >> 0x20) ^ sk_exp[uVar6 * 8 + 2];
      uStack_b0 = uStack_90 ^ uVar9 ^ uVar12 ^ (uVar18 << 0x20 | uVar18 >> 0x20) ^
                  sk_exp[uVar6 * 8 + 3];
      local_a8 = uStack_90 ^ uVar18 ^ uVar15 ^ (uVar5 << 0x20 | uVar5 >> 0x20) ^
                 sk_exp[uVar6 * 8 + 4];
      uStack_a0 = uVar5 ^ uVar3 ^ (uVar10 << 0x20 | uVar10 >> 0x20) ^ sk_exp[uVar6 * 8 + 5];
      local_98 = uVar10 ^ uVar4 ^ (uVar19 << 0x20 | uVar19 >> 0x20) ^ sk_exp[uVar6 * 8 + 6];
      uStack_90 = (uStack_90 << 0x20 | uStack_90 >> 0x20) ^ uVar8 ^ uVar19 ^ sk_exp[uVar6 * 8 + 7];
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_80);
  }
  br_aes_ct64_bitslice_Sbox(&local_c8);
  lVar17 = 0;
  do {
    uVar2 = (&local_c8)[lVar17];
    uVar6 = (&uStack_c0)[lVar17];
    (&local_c8)[lVar17] =
         (uVar2 & 0xfff000000000000) << 4 |
         uVar2 >> 0xc & 0xf000000000000 | (uVar2 & 0xff00000000) << 8 |
         uVar2 >> 8 & 0xff00000000 | (uVar2 & 0xf0000) << 0xc |
         uVar2 >> 4 & 0xfff0000 | uVar2 & 0xffff;
    (&uStack_c0)[lVar17] =
         (uVar6 & 0xfff000000000000) << 4 |
         uVar6 >> 0xc & 0xf000000000000 | (uVar6 & 0xff00000000) << 8 |
         uVar6 >> 8 & 0xff00000000 | (uVar6 & 0xf0000) << 0xc |
         uVar6 >> 4 & 0xfff0000 | uVar6 & 0xffff;
    lVar17 = lVar17 + 2;
  } while (lVar17 != 8);
  uVar2 = (ulong)(uint)((int)local_88 << 3);
  puVar13 = sk_exp + uVar2;
  local_c8 = CONCAT44(*(uint *)((long)puVar13 + 4) ^ local_c8._4_4_,(uint)*puVar13 ^ (uint)local_c8)
  ;
  uStack_c0 = CONCAT44(*(uint *)((long)puVar13 + 0xc) ^ uStack_c0._4_4_,
                       (uint)puVar13[1] ^ (uint)uStack_c0);
  puVar13 = sk_exp + uVar2 + 2;
  local_b8 = CONCAT44(*(uint *)((long)puVar13 + 4) ^ local_b8._4_4_,(uint)*puVar13 ^ (uint)local_b8)
  ;
  uStack_b0 = CONCAT44(*(uint *)((long)puVar13 + 0xc) ^ uStack_b0._4_4_,
                       (uint)puVar13[1] ^ (uint)uStack_b0);
  puVar13 = sk_exp + uVar2 + 4;
  local_a8 = CONCAT44(*(uint *)((long)puVar13 + 4) ^ local_a8._4_4_,(uint)*puVar13 ^ (uint)local_a8)
  ;
  uStack_a0 = CONCAT44(*(uint *)((long)puVar13 + 0xc) ^ uStack_a0._4_4_,
                       (uint)puVar13[1] ^ (uint)uStack_a0);
  puVar13 = sk_exp + uVar2 + 6;
  local_98 = CONCAT44(*(uint *)((long)puVar13 + 4) ^ local_98._4_4_,(uint)*puVar13 ^ (uint)local_98)
  ;
  uStack_90 = CONCAT44(*(uint *)((long)puVar13 + 0xc) ^ uStack_90._4_4_,
                       (uint)puVar13[1] ^ (uint)uStack_90);
  br_aes_ct64_ortho(&local_c8);
  lVar17 = 0;
  do {
    uVar2 = *(ulong *)((long)&local_c8 + lVar17);
    uVar6 = *(ulong *)((long)&uStack_c0 + lVar17);
    uVar3 = *(ulong *)((long)&local_a8 + lVar17);
    uVar4 = *(ulong *)((long)&uStack_a0 + lVar17);
    uVar5 = uVar2 & 0xff000000ff00 | uVar2 >> 8 & 0xff000000ff0000;
    uVar7 = uVar6 & 0xff000000ff00 | uVar6 >> 8 & 0xff000000ff0000;
    uVar8 = uVar3 & 0xff000000ff00 | uVar3 >> 8 & 0xff000000ff0000;
    uVar9 = uVar4 & 0xff000000ff00 | uVar4 >> 8 & 0xff000000ff0000;
    uVar10 = ((uVar2 & 0xff00ff00ff00ff) >> 8 | uVar2 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar11 = ((uVar6 & 0xff00ff00ff00ff) >> 8 | uVar6 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar2 = ((uVar3 & 0xff00ff00ff00ff) >> 8 | uVar3 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    uVar6 = ((uVar4 & 0xff00ff00ff00ff) >> 8 | uVar4 & 0xff00ff00ff00ff) & 0xffff0000ffff;
    lVar1 = lVar17 * 2;
    *(uint *)((long)&local_68 + lVar1) = (uint)(uVar11 >> 0x10) | (uint)uVar11;
    *(uint *)((long)&local_68 + lVar1 + 4) = (uint)(uVar6 >> 0x10) | (uint)uVar6;
    *(uint *)((long)&uStack_60 + lVar1) = (uint)(uVar7 >> 0x18) | (uint)(uVar7 >> 8);
    *(uint *)((long)&uStack_60 + lVar1 + 4) = (uint)(uVar9 >> 0x18) | (uint)(uVar9 >> 8);
    lVar1 = lVar17 * 2;
    *(uint *)((long)&local_78 + lVar1) = (uint)(uVar10 >> 0x10) | (uint)uVar10;
    *(uint *)((long)&local_78 + lVar1 + 4) = (uint)(uVar2 >> 0x10) | (uint)uVar2;
    *(uint *)((long)&uStack_70 + lVar1) = (uint)(uVar5 >> 0x18) | (uint)(uVar5 >> 8);
    *(uint *)((long)&uStack_70 + lVar1 + 4) = (uint)(uVar8 >> 0x18) | (uint)(uVar8 >> 8);
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x20);
  lVar17 = 0;
  do {
    *(undefined4 *)(out + lVar17 * 4) = *(undefined4 *)((long)&local_78 + lVar17 * 4);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x10);
  return;
}

Assistant:

static void aes_ecb4x(unsigned char out[64], const uint32_t ivw[16], const uint64_t *sk_exp, unsigned int nrounds) {
    uint32_t w[16];
    uint64_t q[8];
    unsigned int i;

    memcpy(w, ivw, sizeof(w));
    for (i = 0; i < 4; i++) {
        br_aes_ct64_interleave_in(&q[i], &q[i + 4], w + (i << 2));
    }
    br_aes_ct64_ortho(q);


    add_round_key(q, sk_exp);
    for (i = 1; i < nrounds; i++) {
        br_aes_ct64_bitslice_Sbox(q);
        shift_rows(q);
        mix_columns(q);
        add_round_key(q, sk_exp + (i << 3));
    }
    br_aes_ct64_bitslice_Sbox(q);
    shift_rows(q);
    add_round_key(q, sk_exp + 8 * nrounds);

    br_aes_ct64_ortho(q);
    for (i = 0; i < 4; i ++) {
        br_aes_ct64_interleave_out(w + (i << 2), q[i], q[i + 4]);
    }
    br_range_enc32le(out, w, 16);
}